

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce.h
# Opt level: O0

tuple<int_&&,_float_&&,_char_&&,_int_&&,_int_&&> * __thiscall
omp::details::
tuple_map_<0ul,1ul,2ul,3ul,4ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
          (tuple<int_&&,_float_&&,_char_&&,_int_&&,_int_&&> *__return_storage_ptr__,details *this,
          tuple<int,_float,_char,_int,_int> *param_3)

{
  int *__elements;
  float *__elements_1;
  char *__elements_2;
  int *__elements_3;
  int *__elements_4;
  tuple<int,_float,_char,_int,_int> *tups_local;
  anon_class_1_0_00000001 *call_local;
  
  __elements = map_one<0ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
                         ((anon_class_1_0_00000001 *)this,param_3);
  __elements_1 = map_one<1ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
                           ((anon_class_1_0_00000001 *)this,param_3);
  __elements_2 = map_one<2ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
                           ((anon_class_1_0_00000001 *)this,param_3);
  __elements_3 = map_one<3ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
                           ((anon_class_1_0_00000001 *)this,param_3);
  __elements_4 = map_one<4ul,omp_tuple_map_tuple_type_depends_on_lambda_rvalue__ref_res_Test::TestBody()::__0,std::tuple<int,float,char,int,int>>
                           ((anon_class_1_0_00000001 *)this,param_3);
  std::tuple<int_&&,_float_&&,_char_&&,_int_&&,_int_&&>::
  tuple<int,_float,_char,_int,_int,_true,_true>
            (__return_storage_ptr__,__elements,__elements_1,__elements_2,__elements_3,__elements_4);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto tuple_map_(std::index_sequence<Idxs...>, Callable &&call,
                          Tuples &&...tups) {
  return std::tuple<decltype(map_one<Idxs>(std::forward<Callable>(call),
                                           std::forward<Tuples>(tups)...))...>(
      map_one<Idxs>(std::forward<Callable>(call),
                    std::forward<Tuples>(tups)...)...);
}